

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O1

boolean monclass_nogen(char monclass)

{
  char *pcVar1;
  int first;
  ulong uVar2;
  long lVar3;
  
  pcVar1 = &mons[0].mlet;
  uVar2 = 0;
  do {
    if (*pcVar1 == monclass) goto LAB_001be4f2;
    uVar2 = uVar2 + 1;
    pcVar1 = pcVar1 + 0x40;
  } while (uVar2 != 0x158);
  uVar2 = 0x158;
LAB_001be4f2:
  if ((uint)uVar2 == 0x158) {
    return '\0';
  }
  if ((uint)uVar2 < 0x158) {
    lVar3 = (uVar2 & 0xffffffff) << 6;
    do {
      if (*(char *)((long)(mons[0].mattk + -2) + lVar3) != monclass) {
        return '\x01';
      }
      if ((*(byte *)((long)mons[0].mattk + lVar3 + -1) & 2) == 0) {
        return '\0';
      }
      lVar3 = lVar3 + 0x40;
    } while (lVar3 != 0x5600);
  }
  return '\x01';
}

Assistant:

boolean monclass_nogen(char monclass)
{
	int first, i;

/*	Assumption #1:	monsters of a given class are contiguous in the
 *			mons[] array.
 */
	for (first = LOW_PM; first < SPECIAL_PM; first++)
	    if (mons[first].mlet == monclass) break;
	if (first == SPECIAL_PM) return FALSE;

	for (i = first; i < SPECIAL_PM && mons[i].mlet == monclass; i++)
	    if (!(mons[i].geno & G_NOGEN)) return FALSE;
	return TRUE;
}